

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::writeFinalRule
          (VTimeZone *this,VTZWriter *writer,UBool isDst,AnnualTimeZoneRule *rule,
          int32_t fromRawOffset,int32_t fromDSTSavings,UDate startTime,UErrorCode *status)

{
  undefined4 toOffset_00;
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  DateRuleType DVar4;
  int32_t iVar5;
  DateTimeRule *rule_00;
  bool bVar6;
  undefined1 local_98 [8];
  UnicodeString name;
  int32_t toOffset;
  int32_t timeInDay;
  DateTimeRule *dtrule;
  UDate UStack_40;
  UBool modifiedRule;
  UDate startTime_local;
  int32_t fromDSTSavings_local;
  int32_t fromRawOffset_local;
  AnnualTimeZoneRule *rule_local;
  UBool isDst_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    rule_00 = AnnualTimeZoneRule::getRule(rule);
    _toOffset = toWallTimeRule(rule_00,fromRawOffset,fromDSTSavings);
    bVar6 = _toOffset == (DateTimeRule *)0x0;
    if (bVar6) {
      _toOffset = AnnualTimeZoneRule::getRule(rule);
    }
    dtrule._7_1_ = !bVar6;
    name.fUnion._52_4_ = DateTimeRule::getRuleMillisInDay(_toOffset);
    if ((int)name.fUnion._52_4_ < 0) {
      UStack_40 = startTime + (double)(int)-name.fUnion._52_4_;
    }
    else {
      UStack_40 = startTime;
      if (86399999 < (int)name.fUnion._52_4_) {
        UStack_40 = startTime - (double)(name.fUnion._52_4_ + -86399999);
      }
    }
    iVar2 = TimeZoneRule::getRawOffset(&rule->super_TimeZoneRule);
    iVar3 = TimeZoneRule::getDSTSavings(&rule->super_TimeZoneRule);
    name.fUnion._48_4_ = iVar2 + iVar3;
    UnicodeString::UnicodeString((UnicodeString *)local_98);
    TimeZoneRule::getName(&rule->super_TimeZoneRule,(UnicodeString *)local_98);
    DVar4 = DateTimeRule::getDateRuleType(_toOffset);
    toOffset_00 = name.fUnion._48_4_;
    switch(DVar4) {
    case DOM:
      iVar2 = DateTimeRule::getRuleMonth(_toOffset);
      iVar3 = DateTimeRule::getRuleDayOfMonth(_toOffset);
      writeZonePropsByDOM(this,writer,isDst,(UnicodeString *)local_98,fromRawOffset + fromDSTSavings
                          ,toOffset_00,iVar2,iVar3,UStack_40,1.838821689216e+17,status);
      break;
    case DOW:
      iVar2 = DateTimeRule::getRuleMonth(_toOffset);
      iVar3 = DateTimeRule::getRuleWeekInMonth(_toOffset);
      iVar5 = DateTimeRule::getRuleDayOfWeek(_toOffset);
      writeZonePropsByDOW(this,writer,isDst,(UnicodeString *)local_98,fromRawOffset + fromDSTSavings
                          ,toOffset_00,iVar2,iVar3,iVar5,UStack_40,1.838821689216e+17,status);
      break;
    case DOW_GEQ_DOM:
      iVar2 = DateTimeRule::getRuleMonth(_toOffset);
      iVar3 = DateTimeRule::getRuleDayOfMonth(_toOffset);
      iVar5 = DateTimeRule::getRuleDayOfWeek(_toOffset);
      writeZonePropsByDOW_GEQ_DOM
                (this,writer,isDst,(UnicodeString *)local_98,fromRawOffset + fromDSTSavings,
                 toOffset_00,iVar2,iVar3,iVar5,UStack_40,1.838821689216e+17,status);
      break;
    case DOW_LEQ_DOM:
      iVar2 = DateTimeRule::getRuleMonth(_toOffset);
      iVar3 = DateTimeRule::getRuleDayOfMonth(_toOffset);
      iVar5 = DateTimeRule::getRuleDayOfWeek(_toOffset);
      writeZonePropsByDOW_LEQ_DOM
                (this,writer,isDst,(UnicodeString *)local_98,fromRawOffset + fromDSTSavings,
                 toOffset_00,iVar2,iVar3,iVar5,UStack_40,1.838821689216e+17,status);
    }
    if ((dtrule._7_1_) && (_toOffset != (DateTimeRule *)0x0)) {
      (*(_toOffset->super_UObject)._vptr_UObject[1])();
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_98);
  }
  return;
}

Assistant:

void
VTimeZone::writeFinalRule(VTZWriter& writer, UBool isDst, const AnnualTimeZoneRule* rule,
                          int32_t fromRawOffset, int32_t fromDSTSavings,
                          UDate startTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    UBool modifiedRule = TRUE;
    const DateTimeRule *dtrule = toWallTimeRule(rule->getRule(), fromRawOffset, fromDSTSavings);
    if (dtrule == NULL) {
        modifiedRule = FALSE;
        dtrule = rule->getRule();
    }

    // If the rule's mills in a day is out of range, adjust start time.
    // Olson tzdata supports 24:00 of a day, but VTIMEZONE does not.
    // See ticket#7008/#7518

    int32_t timeInDay = dtrule->getRuleMillisInDay();
    if (timeInDay < 0) {
        startTime = startTime + (0 - timeInDay);
    } else if (timeInDay >= U_MILLIS_PER_DAY) {
        startTime = startTime - (timeInDay - (U_MILLIS_PER_DAY - 1));
    }

    int32_t toOffset = rule->getRawOffset() + rule->getDSTSavings();
    UnicodeString name;
    rule->getName(name);
    switch (dtrule->getDateRuleType()) {
    case DateTimeRule::DOM:
        writeZonePropsByDOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW:
        writeZonePropsByDOW(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleWeekInMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_GEQ_DOM:
        writeZonePropsByDOW_GEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    case DateTimeRule::DOW_LEQ_DOM:
        writeZonePropsByDOW_LEQ_DOM(writer, isDst, name, fromRawOffset + fromDSTSavings, toOffset,
                dtrule->getRuleMonth(), dtrule->getRuleDayOfMonth(), dtrule->getRuleDayOfWeek(), startTime, MAX_MILLIS, status);
        break;
    }
    if (modifiedRule) {
        delete dtrule;
    }
}